

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask sqlite3WhereExprUsageFull(WhereMaskSet *pMaskSet,Expr *p)

{
  ExprList *pEVar1;
  Bitmask BVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Window *pWVar6;
  int iVar7;
  long lVar8;
  ExprList_item *pEVar9;
  ulong uVar10;
  
  if (p->op == 0xb3) {
    uVar10 = 1;
    if (pMaskSet->ix[0] != p->iTable) {
      if ((long)pMaskSet->n < 2) goto LAB_00199bc0;
      lVar8 = 1;
      uVar10 = 0;
      do {
        if (pMaskSet->ix[lVar8] == p->iTable) {
          uVar10 = 1L << ((byte)lVar8 & 0x3f);
          break;
        }
        lVar8 = lVar8 + 1;
      } while (pMaskSet->n != lVar8);
    }
  }
  else {
LAB_00199bc0:
    uVar10 = 0;
  }
  if (p->pLeft != (Expr *)0x0) {
    BVar2 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
    uVar10 = uVar10 | BVar2;
  }
  if (p->pRight == (Expr *)0x0) {
    if ((p->flags >> 0xc & 1) == 0) {
      pEVar1 = (p->x).pList;
      if (pEVar1 != (ExprList *)0x0) {
        iVar7 = pEVar1->nExpr;
        if (iVar7 < 1) {
          uVar3 = 0;
        }
        else {
          pEVar9 = pEVar1->a;
          lVar8 = 0;
          uVar3 = 0;
          do {
            if (pEVar9->pExpr == (Expr *)0x0) {
              uVar4 = 0;
            }
            else {
              uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar9->pExpr);
              iVar7 = pEVar1->nExpr;
            }
            uVar3 = uVar3 | uVar4;
            lVar8 = lVar8 + 1;
            pEVar9 = pEVar9 + 1;
          } while (lVar8 < iVar7);
        }
        uVar10 = uVar10 | uVar3;
      }
      goto LAB_00199c61;
    }
    if ((p->flags & 0x40) != 0) {
      pMaskSet->bVarSelect = 1;
    }
    uVar3 = exprSelectUsage(pMaskSet,(p->x).pSelect);
  }
  else {
    uVar3 = sqlite3WhereExprUsageNN(pMaskSet,p->pRight);
  }
  uVar10 = uVar10 | uVar3;
LAB_00199c61:
  if (((p->op == 0xac) || (p->op == 0xa9)) && ((p->flags & 0x1000000) != 0)) {
    pWVar6 = (p->y).pWin;
    pEVar1 = pWVar6->pPartition;
    if ((pEVar1 == (ExprList *)0x0) || (iVar7 = pEVar1->nExpr, iVar7 < 1)) {
      uVar3 = 0;
    }
    else {
      pEVar9 = pEVar1->a;
      lVar8 = 0;
      uVar3 = 0;
      do {
        if (pEVar9->pExpr == (Expr *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar9->pExpr);
          iVar7 = pEVar1->nExpr;
        }
        uVar3 = uVar3 | uVar4;
        lVar8 = lVar8 + 1;
        pEVar9 = pEVar9 + 1;
      } while (lVar8 < iVar7);
      pWVar6 = (p->y).pWin;
    }
    pEVar1 = pWVar6->pOrderBy;
    if ((pEVar1 == (ExprList *)0x0) || (iVar7 = pEVar1->nExpr, iVar7 < 1)) {
      uVar4 = 0;
    }
    else {
      pEVar9 = pEVar1->a;
      lVar8 = 0;
      uVar4 = 0;
      do {
        if (pEVar9->pExpr == (Expr *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar9->pExpr);
          iVar7 = pEVar1->nExpr;
        }
        uVar4 = uVar4 | uVar5;
        lVar8 = lVar8 + 1;
        pEVar9 = pEVar9 + 1;
      } while (lVar8 < iVar7);
      pWVar6 = (p->y).pWin;
    }
    if (pWVar6->pFilter == (Expr *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pWVar6->pFilter);
    }
    uVar10 = uVar5 | uVar10 | uVar3 | uVar4;
  }
  return uVar10;
}

Assistant:

static SQLITE_NOINLINE Bitmask sqlite3WhereExprUsageFull(
  WhereMaskSet *pMaskSet,
  Expr *p
){
  Bitmask mask;
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprUseXSelect(p) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  if( (p->op==TK_FUNCTION || p->op==TK_AGG_FUNCTION) && ExprUseYWin(p) ){
    assert( p->y.pWin!=0 );
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pPartition);
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, p->y.pWin->pFilter);
  }
#endif
  return mask;
}